

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_pointer.hpp
# Opt level: O0

int libtorrent::aux::portable_fseeko(FILE *f,int64_t offset,int whence)

{
  int iVar1;
  int whence_local;
  int64_t offset_local;
  FILE *f_local;
  
  iVar1 = fseeko64((FILE *)f,offset,whence);
  return iVar1;
}

Assistant:

inline int portable_fseeko(FILE* const f, std::int64_t const offset, int const whence)
{
#ifdef TORRENT_WINDOWS
	return ::_fseeki64(f, offset, whence);
#elif TORRENT_HAS_FSEEKO
	return ::fseeko(f, offset, whence);
#else
	int const fd = ::fileno(f);
	return ::lseek64(fd, offset, whence) == -1 ? -1 : 0;
#endif
}